

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_sim.c
# Opt level: O3

int cvNlsLSolveSensSim(N_Vector deltaSim,void *cvode_mem)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (cvode_mem == (void *)0x0) {
    iVar3 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x157,"cvNlsLSolveSensSim",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    iVar2 = (**(code **)((long)cvode_mem + 2000))
                      (cvode_mem,**deltaSim->content,*(undefined8 *)((long)cvode_mem + 0x1b8),
                       *(undefined8 *)((long)cvode_mem + 0x1c0),
                       *(undefined8 *)((long)cvode_mem + 0x1d8));
    iVar3 = -7;
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        if (0 < *(int *)((long)cvode_mem + 0x90)) {
          lVar1 = *deltaSim->content;
          lVar4 = 0;
          do {
            iVar3 = (**(code **)((long)cvode_mem + 2000))
                              (cvode_mem,*(undefined8 *)(lVar1 + 8 + lVar4 * 8),
                               *(undefined8 *)(*(long *)((long)cvode_mem + 0x2f0) + lVar4 * 8),
                               *(undefined8 *)((long)cvode_mem + 0x1c0),
                               *(undefined8 *)((long)cvode_mem + 0x1d8));
            if (iVar3 < 0) {
              return -7;
            }
            if (iVar3 != 0) goto LAB_0012c489;
            lVar4 = lVar4 + 1;
          } while (lVar4 < *(int *)((long)cvode_mem + 0x90));
        }
        iVar3 = 0;
      }
      else {
LAB_0012c489:
        iVar3 = 0x386;
      }
    }
  }
  return iVar3;
}

Assistant:

static int cvNlsLSolveSensSim(N_Vector deltaSim, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval, is;
  N_Vector delta;
  N_Vector* deltaS;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* extract state delta from the vector wrapper */
  delta = NV_VEC_SW(deltaSim, 0);

  /* solve the state linear system */
  retval = cv_mem->cv_lsolve(cv_mem, delta, cv_mem->cv_ewt, cv_mem->cv_y,
                             cv_mem->cv_ftemp);

  if (retval < 0) { return (CV_LSOLVE_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  /* extract sensitivity deltas from the vector wrapper */
  deltaS = NV_VECS_SW(deltaSim) + 1;

  /* solve the sensitivity linear systems */
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    retval = cv_mem->cv_lsolve(cv_mem, deltaS[is], cv_mem->cv_ewtS[is],
                               cv_mem->cv_y, cv_mem->cv_ftemp);

    if (retval < 0) { return (CV_LSOLVE_FAIL); }
    if (retval > 0) { return (SUN_NLS_CONV_RECVR); }
  }

  return (CV_SUCCESS);
}